

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoTuples.h
# Opt level: O2

void __thiscall
chrono::
ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
::Build_Cq(ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           *this,ChSparseMatrix *storage,int insrow)

{
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Build_Cq
            (&this->tuple_a,storage,insrow);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::Build_Cq
            (&this->tuple_b,storage,insrow);
  return;
}

Assistant:

virtual void Build_Cq(ChSparseMatrix& storage, int insrow) override {
        tuple_a.Build_Cq(storage, insrow);
        tuple_b.Build_Cq(storage, insrow);
    }